

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnSimdShuffleOp(TypeChecker *this,Opcode opcode,v128 lane_idx)

{
  Result RVar1;
  int i;
  long lVar2;
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = lane_idx.v._0_8_;
  local_30 = lane_idx.v._8_8_;
  lVar2 = 0;
  do {
    if (0x1f < *(byte *)((long)&local_38 + lVar2)) {
      PrintError(this,"lane index must be less than 32 (got %d)");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  RVar1 = CheckOpcode2(this,opcode);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnSimdShuffleOp(Opcode opcode, v128 lane_idx) {
  Result result = Result::Error;
  uint8_t simd_data[16];
  memcpy(simd_data, &lane_idx, 16);
  for (int i = 0; i < 16; i++) {
    if (simd_data[i] >= 32) {
      PrintError("lane index must be less than 32 (got %d)", simd_data[i]);
    }
  }

  result = CheckOpcode2(opcode);
  return result;
}